

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.h
# Opt level: O0

void internal_exr_lock(exr_const_context_t c)

{
  long in_RDI;
  exr_context_t nonc;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x1f8));
  return;
}

Assistant:

static inline void
internal_exr_lock (exr_const_context_t c)
{
#ifdef ILMTHREAD_THREADING_ENABLED
    exr_context_t nonc = EXR_CONST_CAST (exr_context_t, c);
#    ifdef _WIN32
    EnterCriticalSection (&nonc->mutex);
#    else
    pthread_mutex_lock (&nonc->mutex);
#    endif
#endif
}